

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Type __thiscall wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  HeapType HVar4;
  Nullability NVar5;
  Type type_local;
  Type local_28;
  Type superType;
  
  HVar4.id = ::wasm::Type::getHeapType();
  HVar4 = getSuperType(this,HVar4);
  iVar2 = ::wasm::Type::getNullability();
  NVar5 = Nullable;
  if ((iVar2 != 1) && (((this->wasm->features).features & 0x400) != 0)) {
    uVar3 = Random::upTo(&this->random,2);
    if (uVar3 == 0) {
      NVar5 = NonNullable;
    }
  }
  ::wasm::Type::Type(&local_28,HVar4,NVar5);
  bVar1 = isUninhabitable(local_28);
  if (bVar1) {
    ::wasm::Type::Type(&type_local,HVar4,Nullable);
    local_28.id = type_local.id;
  }
  return (Type)local_28.id;
}

Assistant:

Type TranslateToFuzzReader::getSuperType(Type type) {
  auto heapType = getSuperType(type.getHeapType());
  auto nullability = getSuperType(type.getNullability());
  auto superType = Type(heapType, nullability);
  // As with getSubType, we want to avoid returning an uninhabitable type where
  // possible. Here all we can do is flip the super's nullability to nullable.
  if (isUninhabitable(superType)) {
    superType = Type(heapType, Nullable);
  }
  return superType;
}